

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

string * __thiscall
chrono::
ChValueSpecific<std::vector<chrono::ChQuaternion<double>,std::allocator<chrono::ChQuaternion<double>>>>
::GetClassRegisteredName_abi_cxx11_
          (ChValueSpecific<std::vector<chrono::ChQuaternion<double>,std::allocator<chrono::ChQuaternion<double>>>>
           *this)

{
  int iVar1;
  ChClassFactory *this_00;
  string *psVar2;
  
  if (GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    if (iVar1 != 0) {
      GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_);
    }
  }
  psVar2 = &GetClassRegisteredName[abi:cxx11]()::nostring_abi_cxx11_;
  if (*(long *)(this + 0x30) != 0) {
    this_00 = ChClassFactory::GetGlobalClassFactory();
    psVar2 = ChClassFactory::_GetClassTagName_abi_cxx11_
                       (this_00,(type_info *)
                                &std::
                                 vector<chrono::ChQuaternion<double>,std::allocator<chrono::ChQuaternion<double>>>
                                 ::typeinfo);
  }
  return psVar2;
}

Assistant:

virtual std::string& GetClassRegisteredName() {
          static std::string nostring("");
          if (!_ptr_to_val) {
              return nostring;
          }
          try {
              return ChClassFactory::GetClassTagName(typeid(*_ptr_to_val));
          }catch (const ChException &) {
              return nostring;
          }
        }